

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O2

int32_t __thiscall
aeron::archive::AeronArchive::listRecordings
          (AeronArchive *this,int64_t fromRecordingId,int32_t recordCount,
          RecordingDescriptorConsumer *consumer)

{
  int64_t iVar1;
  int32_t recordCount_local;
  int64_t fromRecordingId_local;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  local_28 = (code *)0x0;
  pcStack_20 = (code *)0x0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  recordCount_local = recordCount;
  fromRecordingId_local = fromRecordingId;
  local_38._M_unused._M_object = operator_new(0x18);
  *(AeronArchive **)local_38._M_unused._0_8_ = this;
  *(int64_t **)((long)local_38._M_unused._0_8_ + 8) = &fromRecordingId_local;
  *(int32_t **)((long)local_38._M_unused._0_8_ + 0x10) = &recordCount_local;
  pcStack_20 = std::
               _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:249:9)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:249:9)>
             ::_M_manager;
  iVar1 = callAndPollForDescriptors
                    (this,(function<bool_(long)> *)&local_38,recordCount,consumer,"list recordings")
  ;
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return (int32_t)iVar1;
}

Assistant:

std::int32_t AeronArchive::listRecordings(std::int64_t fromRecordingId, std::int32_t recordCount,
                                          RecordingDescriptorConsumer&& consumer) {
    return callAndPollForDescriptors(
        [&](std::int64_t correlationId) {
            return this->archiveProxy_->listRecordings(fromRecordingId, recordCount, correlationId, controlSessionId_);
        },
        recordCount, std::move(consumer), "list recordings");
}